

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::Constraint::Constraint(Constraint *this,size_t size,string *name)

{
  string *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Constraint_003fac20;
  in_RDI[1] = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 6),in_RSI & 0xffffffff);
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 10));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0xe));
  *(undefined1 *)(in_RDI + 0x12) = 0;
  *(undefined1 *)((long)in_RDI + 0x91) = 0;
  iDynTree::VectorDynSize::zero();
  iDynTree::VectorDynSize::resize((ulong)(in_RDI + 10));
  iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0xe));
  return;
}

Assistant:

Constraint::Constraint(size_t size, const std::string name)
        : m_constraintSize(size)
        , m_constraintName(name)
        , m_valueBuffer(static_cast<unsigned int>(size))
        , m_isLowerBounded(false)
        , m_isUpperBounded(false)
        {
            m_valueBuffer.zero();
            m_lowerBound.resize(static_cast<unsigned int>(size));
            m_upperBound.resize(static_cast<unsigned int>(size));
        }